

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

int setup_crldp(X509 *x)

{
  X509 *x_00;
  int iVar1;
  stack_st_DIST_POINT *psVar2;
  size_t sVar3;
  DIST_POINT *dp;
  ulong local_28;
  size_t i;
  X509 *pXStack_18;
  int j;
  X509 *x_local;
  
  pXStack_18 = x;
  psVar2 = (stack_st_DIST_POINT *)X509_get_ext_d2i((X509 *)x,0x67,(int *)((long)&i + 4),(int *)0x0);
  pXStack_18->crldp = psVar2;
  if ((pXStack_18->crldp == (stack_st_DIST_POINT *)0x0) && (i._4_4_ != -1)) {
    x_local._4_4_ = 0;
  }
  else {
    for (local_28 = 0; sVar3 = sk_DIST_POINT_num(pXStack_18->crldp), x_00 = pXStack_18,
        local_28 < sVar3; local_28 = local_28 + 1) {
      dp = sk_DIST_POINT_value(pXStack_18->crldp,local_28);
      iVar1 = setup_dp(x_00,dp);
      if (iVar1 == 0) {
        return 0;
      }
    }
    x_local._4_4_ = 1;
  }
  return x_local._4_4_;
}

Assistant:

static int setup_crldp(X509 *x) {
  int j;
  x->crldp = reinterpret_cast<STACK_OF(DIST_POINT) *>(
      X509_get_ext_d2i(x, NID_crl_distribution_points, &j, NULL));
  if (x->crldp == NULL && j != -1) {
    return 0;
  }
  for (size_t i = 0; i < sk_DIST_POINT_num(x->crldp); i++) {
    if (!setup_dp(x, sk_DIST_POINT_value(x->crldp, i))) {
      return 0;
    }
  }
  return 1;
}